

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O0

void __thiscall EncoderVelocityLocal::PrintFlags(EncoderVelocityLocal *this,ofstream *outFile)

{
  ostream *poVar1;
  string local_68;
  string local_38;
  ofstream *local_18;
  ofstream *outFile_local;
  EncoderVelocityLocal *this_local;
  
  local_18 = outFile;
  outFile_local = (ofstream *)this;
  if (((this->super_EncoderVelocity).velOverflow & 1U) != 0) {
    std::operator<<((ostream *)outFile," VEL_OVF");
  }
  if (((this->super_EncoderVelocity).dirChange & 1U) != 0) {
    std::operator<<((ostream *)local_18," DIR_CHG");
  }
  if (((this->super_EncoderVelocity).encError & 1U) != 0) {
    std::operator<<((ostream *)local_18," ENC_ERR");
  }
  if (((this->super_EncoderVelocity).qtr1Overflow & 1U) != 0) {
    std::operator<<((ostream *)local_18," Q1_OVF");
  }
  if (((this->super_EncoderVelocity).qtr5Overflow & 1U) != 0) {
    std::operator<<((ostream *)local_18," Q5_OVF");
  }
  if ((this->super_EncoderVelocity).qtr1Edges != (this->super_EncoderVelocity).qtr5Edges) {
    poVar1 = std::operator<<((ostream *)local_18," EDGES(");
    GetEdgeString_abi_cxx11_(&local_38,(this->super_EncoderVelocity).qtr1Edges);
    poVar1 = std::operator<<(poVar1,(string *)&local_38);
    poVar1 = std::operator<<(poVar1,":");
    GetEdgeString_abi_cxx11_(&local_68,(this->super_EncoderVelocity).qtr5Edges);
    poVar1 = std::operator<<(poVar1,(string *)&local_68);
    std::operator<<(poVar1,")");
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_38);
  }
  if (((this->super_EncoderVelocity).runOverflow & 1U) != 0) {
    std::operator<<((ostream *)local_18," RUN_OVF");
  }
  return;
}

Assistant:

void EncoderVelocityLocal::PrintFlags(std::ofstream &outFile) const
{
    if (velOverflow)   outFile << " VEL_OVF";
    if (dirChange)     outFile << " DIR_CHG";
    if (encError)      outFile << " ENC_ERR";
    if (qtr1Overflow)  outFile << " Q1_OVF";
    if (qtr5Overflow)  outFile << " Q5_OVF";
    if (qtr1Edges!= qtr5Edges) {
        outFile << " EDGES(" << GetEdgeString(qtr1Edges)
                << ":" <<  GetEdgeString(qtr5Edges) << ")";
    }
    if (runOverflow) outFile << " RUN_OVF";
}